

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

int drmp3_hdr_frame_bytes(drmp3_uint8 *h,int free_format_size)

{
  int iVar1;
  uint uVar2;
  uint in_EDX;
  
  uVar2 = (uint)((ulong)h >> 3) & 1;
  iVar1 = 96000;
  if ((~(uint)h & 6) != 0) {
    iVar1 = (0x480U >> (((uint)h & 0xe) == 2)) * 0xfa;
  }
  uVar2 = (iVar1 * (uint)(byte)drmp3_hdr_bitrate_kbps_halfrate
                               [(ulong)(byte)((byte)free_format_size >> 4) +
                                (long)(int)(((uint)((ulong)h >> 1) & 3) - 1) * 0xf +
                                (ulong)uVar2 * 0x2d]) /
          ((*(uint *)(drmp3_hdr_sample_rate_hz_g_hz + (ulong)((byte)free_format_size >> 2 & 3) * 4)
           >> ((byte)uVar2 ^ 1)) >> (((ulong)h & 0x10) == 0));
  if ((~(byte)h & 6) == 0) {
    uVar2 = uVar2 & 0x7fffffc;
  }
  if (uVar2 == 0) {
    uVar2 = in_EDX;
  }
  return uVar2;
}

Assistant:

static int drmp3_hdr_frame_bytes(const drmp3_uint8 *h, int free_format_size)
{
    int frame_bytes = drmp3_hdr_frame_samples(h)*drmp3_hdr_bitrate_kbps(h)*125/drmp3_hdr_sample_rate_hz(h);
    if (DRMP3_HDR_IS_LAYER_1(h))
    {
        frame_bytes &= ~3; /* slot align */
    }
    return frame_bytes ? frame_bytes : free_format_size;
}